

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

RC __thiscall
QO_Manager::CalcCondsForRel
          (QO_Manager *this,
          map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          *attrStats,int relsInJoin,int relIdx,float *totalTuples,bool *useIdx,int *indexAttr,
          int *indexCond)

{
  bool bVar1;
  RC RVar2;
  int local_50;
  int local_4c;
  int unused_1;
  int attributeNum;
  int unused;
  int i;
  float indexTupleNum;
  RC rc;
  bool *useIdx_local;
  float *totalTuples_local;
  int relIdx_local;
  int relsInJoin_local;
  map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
  *attrStats_local;
  QO_Manager *this_local;
  
  i = 0;
  unused = 0x7f7fffff;
  attributeNum = 0;
  _indexTupleNum = useIdx;
  useIdx_local = (bool *)totalTuples;
  totalTuples_local._0_4_ = relIdx;
  totalTuples_local._4_4_ = relsInJoin;
  _relIdx_local = attrStats;
  attrStats_local =
       (map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_> *)this;
  do {
    if (this->nConds <= attributeNum) {
      return 0;
    }
    bVar1 = UseCondition(this,totalTuples_local._4_4_,attributeNum,(int)totalTuples_local);
    if (bVar1) {
      switch(this->conds[attributeNum].op) {
      case EQ_OP:
        ApplyEQCond(this,_relIdx_local,attributeNum,(float *)useIdx_local);
        break;
      default:
        break;
      case LT_OP:
        ApplyLTCond(this,_relIdx_local,attributeNum,(float *)useIdx_local);
        break;
      case GT_OP:
        ApplyGTCond(this,_relIdx_local,attributeNum,(float *)useIdx_local);
        break;
      case LE_OP:
        ApplyLTCond(this,_relIdx_local,attributeNum,(float *)useIdx_local);
        break;
      case GE_OP:
        ApplyGTCond(this,_relIdx_local,attributeNum,(float *)useIdx_local);
      }
      local_4c = 0;
      i = CondToAttrIdx(this,attributeNum,&local_4c,&unused_1);
      if (i != 0) {
        return i;
      }
      if ((((this->conds[attributeNum].op == EQ_OP) && (this->conds[attributeNum].bRhsIsAttr == 0))
          && ((float)unused < (float)this->attrs[local_4c].numDistinct)) &&
         (this->attrs[local_4c].indexNo != -1)) {
        *_indexTupleNum = true;
        RVar2 = CondToAttrIdx(this,attributeNum,&local_4c,&local_50);
        if (RVar2 != 0) {
          return RVar2;
        }
        *indexCond = attributeNum;
        *indexAttr = local_4c;
        unused = (int)(float)this->attrs[*indexAttr].numDistinct;
      }
      i = 0;
    }
    attributeNum = attributeNum + 1;
  } while( true );
}

Assistant:

RC QO_Manager::CalcCondsForRel(map<int, attrStat> & attrStats, int relsInJoin, int relIdx,
  float &totalTuples, bool &useIdx, int& indexAttr, int& indexCond){
  RC rc = 0;
  // for index joins, it matters how many tuples have that particular
  // value for that attribute, so keep track of the number
  // of distinct values of the index attribute in indexTupleNum
  float indexTupleNum = FLT_MAX;
  // iterate through all conditions to see if they apply to this join
  for(int i=0; i < nConds; i++){
    if(UseCondition(relsInJoin, i, relIdx)){
      switch(conds[i].op){
        case EQ_OP : ApplyEQCond(attrStats, i, totalTuples); break;
        case LT_OP : ApplyLTCond(attrStats, i, totalTuples); break;
        case GT_OP : ApplyGTCond(attrStats, i, totalTuples); break;
        case LE_OP : ApplyLTCond(attrStats, i, totalTuples); break;
        case GE_OP : ApplyGTCond(attrStats, i, totalTuples); break;
        default: break;
      }
      int unused; 
      int attributeNum = 0;
      if((rc = CondToAttrIdx(i, attributeNum, unused)))
        return (rc);
      // if this is an equality condition, and there is an index on one of
      // the attributes, make this the index join attribute if the number of
      // distinct tuples is greater than the previous join attribute candidate
      if(conds[i].op == EQ_OP && !conds[i].bRhsIsAttr && ((float)attrs[attributeNum].numDistinct) > indexTupleNum
        && (attrs[attributeNum].indexNo != -1)){
        // update return values to reflect this index join
        useIdx = true;
        int unused;
        if((rc = CondToAttrIdx(i, attributeNum, unused)))
          return (rc);
        indexCond = i;
        indexAttr = attributeNum;
        indexTupleNum = ((float)attrs[indexAttr].numDistinct);
      }
    }
  }
  return (0);
}